

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::pack_to_dxt(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  int iVar1;
  byte in_DL;
  pixel_format in_ESI;
  orientation_flags_t in_stack_0000001c;
  pack_params *in_stack_00000020;
  bool in_stack_0000002b;
  pixel_format in_stack_0000002c;
  image_u8 *pImage;
  image_u8 tmp_img;
  uint in_stack_ffffffffffffff7c;
  image_u8 *tmp;
  mip_level *in_stack_ffffffffffffff88;
  image_u8 local_50;
  byte local_15;
  byte local_1;
  
  local_15 = in_DL & 1;
  iVar1 = pixel_format_helpers::is_dxt(in_ESI);
  if (iVar1 == 0) {
    local_1 = 0;
  }
  else {
    tmp = &local_50;
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x167ab1);
    get_unpacked_image(in_stack_ffffffffffffff88,tmp,in_stack_ffffffffffffff7c);
    local_1 = pack_to_dxt((mip_level *)tmp_img._0_8_,pImage,in_stack_0000002c,in_stack_0000002b,
                          in_stack_00000020,in_stack_0000001c);
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x167b17);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool mip_level::pack_to_dxt(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  image_u8 tmp_img;
  image_u8* pImage = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  return pack_to_dxt(*pImage, fmt, cook, p, m_orient_flags);
}